

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Throw.cpp
# Opt level: O0

void Js::Throw::OutOfMemory(void)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined8 uVar4;
  
  if ((DAT_01ec1669 & 1) != 0) {
    Output::Print(L"SystemException: OutOfMemory\n");
    Output::Flush();
  }
  bVar2 = JsUtil::ExternalApi::RaiseOutOfMemoryIfScriptActive();
  if (bVar2) {
    AssertCount = AssertCount + 1;
    LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Exceptions/Throw.cpp"
                         ,0x7c,"(false)","We shouldn\'t be here");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  uVar4 = __cxa_allocate_exception(1);
  __cxa_throw(uVar4,&OutOfMemoryException::typeinfo,0);
}

Assistant:

void Throw::OutOfMemory()
    {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (CONFIG_FLAG(PrintSystemException))
        {
            Output::Print(_u("SystemException: OutOfMemory\n"));
            Output::Flush();
        }
#endif
        if (JsUtil::ExternalApi::RaiseOutOfMemoryIfScriptActive())
        {
            AssertMsg(false, "We shouldn't be here");
        }
        throw OutOfMemoryException();
    }